

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::scaleRowInterface(Highs *this,HighsInt row,double scale_value)

{
  LpAction action;
  HighsStatus HVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  int in_ESI;
  HEkk *in_RDI;
  double in_XMM0_Qa;
  HighsInt var;
  SimplexBasis *simplex_basis;
  HighsSimplexStatus *simplex_status;
  HighsBasis *basis;
  HighsLp *lp;
  HighsStatus return_status;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  HighsLogOptions *in_stack_ffffffffffffff00;
  Highs *this_00;
  HEkk *this_01;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  HighsInt row_00;
  vector<int,_std::allocator<int>_> *pvVar5;
  HighsLp *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff40;
  HighsStatus in_stack_ffffffffffffff48;
  HighsStatus in_stack_ffffffffffffff4c;
  HighsLogOptions *in_stack_ffffffffffffff50;
  HighsStatus local_4;
  
  row_00 = (HighsInt)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  this_01 = in_RDI;
  HighsLp::ensureColwise((HighsLp *)0x4dd329);
  if (in_ESI < 0) {
    local_4 = kError;
  }
  else if (in_ESI < *(int *)&(in_RDI->analysis_).rebuild_reason_string.field_0x4) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      HighsLogOptions::HighsLogOptions
                (in_stack_ffffffffffffff00,
                 (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      action = applyScalingToLpRow(in_stack_ffffffffffffff28,row_00,
                                   (double)CONCAT44(in_stack_ffffffffffffff1c,
                                                    in_stack_ffffffffffffff18));
      this_00 = (Highs *)&stack0xffffffffffffff2f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff30,"applyScalingToLpRow",(allocator *)this_00);
      HVar1 = interpretCallStatus(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                  in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4dd43a);
      if (HVar1 == kError) {
        local_4 = kError;
      }
      else {
        if ((in_XMM0_Qa < 0.0) && (((in_RDI->analysis_).model_name_._M_string_length & 1) != 0)) {
          pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              &(in_RDI->analysis_).log_options.log_to_console,(long)in_ESI);
          if (*pvVar3 == kLower) {
            pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                &(in_RDI->analysis_).log_options.log_to_console,(long)in_ESI);
            *pvVar3 = kUpper;
          }
          else {
            pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                &(in_RDI->analysis_).log_options.log_to_console,(long)in_ESI);
            if (*pvVar3 == kUpper) {
              pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                                 ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                  &(in_RDI->analysis_).log_options.log_to_console,(long)in_ESI);
              *pvVar3 = kLower;
            }
          }
        }
        if (((((ulong)in_RDI->edge_weight_error_ & 0x1000000) != 0) &&
            (pvVar5 = &this_01[1].analysis_.ftran_upper_sparse_density.count_, in_XMM0_Qa < 0.0)) &&
           (((ulong)in_RDI->edge_weight_error_ & 0x100000000) != 0)) {
          iVar2 = *(int *)&(in_RDI->analysis_).rebuild_reason_string + in_ESI;
          pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)
                              &this_01[1].analysis_.before_ftran_upper_hyper_density.
                               distribution_name_.field_2,(long)iVar2);
          if (*pvVar4 == '\x01') {
            pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)(pvVar5 + 2),
                                (long)iVar2);
            *pvVar4 = -1;
          }
          else {
            pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)(pvVar5 + 2),
                                (long)iVar2);
            if (*pvVar4 == -1) {
              pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)(pvVar5 + 2),
                                  (long)iVar2);
              *pvVar4 = '\x01';
            }
          }
        }
        invalidateModelStatusSolutionAndInfo(this_00);
        HEkk::updateStatus(this_01,action);
        local_4 = kOk;
      }
    }
    else {
      local_4 = kError;
    }
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::scaleRowInterface(const HighsInt row,
                                     const double scale_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsSimplexStatus& simplex_status = ekk_instance_.status_;

  // Ensure that the LP is column-wise
  lp.ensureColwise();

  if (row < 0) return HighsStatus::kError;
  if (row >= lp.num_row_) return HighsStatus::kError;
  if (!scale_value) return HighsStatus::kError;

  return_status = interpretCallStatus(options_.log_options,
                                      applyScalingToLpRow(lp, row, scale_value),
                                      return_status, "applyScalingToLpRow");
  if (return_status == HighsStatus::kError) return return_status;

  if (scale_value < 0 && basis.valid) {
    // Negative, so flip any nonbasic status
    if (basis.row_status[row] == HighsBasisStatus::kLower) {
      basis.row_status[row] = HighsBasisStatus::kUpper;
    } else if (basis.row_status[row] == HighsBasisStatus::kUpper) {
      basis.row_status[row] = HighsBasisStatus::kLower;
    }
  }
  if (simplex_status.initialised_for_solve) {
    SimplexBasis& simplex_basis = ekk_instance_.basis_;
    if (scale_value < 0 && simplex_status.has_basis) {
      // Negative, so flip any nonbasic status
      const HighsInt var = lp.num_col_ + row;
      if (simplex_basis.nonbasicMove_[var] == kNonbasicMoveUp) {
        simplex_basis.nonbasicMove_[var] = kNonbasicMoveDn;
      } else if (simplex_basis.nonbasicMove_[var] == kNonbasicMoveDn) {
        simplex_basis.nonbasicMove_[var] = kNonbasicMoveUp;
      }
    }
  }
  // Deduce the consequences of a scaled row
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kScaledRow);
  return HighsStatus::kOk;
}